

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O3

void md5_32(void *key,int len,uint32_t seed,void *out)

{
  uint hash [4];
  undefined4 local_118 [4];
  md5_context local_108;
  
  local_108.total[0] = 0;
  local_108.total[1] = 0;
  local_108.state[1] = 0xefcdab89;
  local_108.state[2] = 0x98badcfe;
  local_108.state[0] = (ulong)seed + 0x67452301;
  local_108.state[3] = 0x10325476;
  md5_update(&local_108,(uchar *)key,len);
  md5_finish(&local_108,(uchar *)local_118);
  *(undefined4 *)out = local_118[0];
  return;
}

Assistant:

void md5_32            ( const void * key, int len, uint32_t seed, void * out )
{
  unsigned int hash[4];

  md5((unsigned char*)key,len,(unsigned char*)hash, seed);

  *(uint32_t*)out = hash[0];
}